

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O0

void __thiscall
Corrade::Utility::ConfigurationGroup::ConfigurationGroup
          (ConfigurationGroup *this,ConfigurationGroup *other)

{
  bool bVar1;
  reference pGVar2;
  ConfigurationGroup *this_00;
  Group *group;
  iterator __end2;
  iterator __begin2;
  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
  *__range2;
  ConfigurationGroup *other_local;
  ConfigurationGroup *this_local;
  
  std::
  vector<Corrade::Utility::ConfigurationGroup::Value,_std::allocator<Corrade::Utility::ConfigurationGroup::Value>_>
  ::vector(&this->_values,&other->_values);
  std::
  vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
  ::vector(&this->_groups,&other->_groups);
  this->_configuration = (Configuration *)0x0;
  __end2 = std::
           vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
           ::begin(&this->_groups);
  group = (Group *)std::
                   vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>
                   ::end(&this->_groups);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
                                *)&group);
    if (!bVar1) break;
    pGVar2 = __gnu_cxx::
             __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
             ::operator*(&__end2);
    this_00 = (ConfigurationGroup *)operator_new(0x38);
    ConfigurationGroup(this_00,pGVar2->group);
    pGVar2->group = this_00;
    __gnu_cxx::
    __normal_iterator<Corrade::Utility::ConfigurationGroup::Group_*,_std::vector<Corrade::Utility::ConfigurationGroup::Group,_std::allocator<Corrade::Utility::ConfigurationGroup::Group>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

ConfigurationGroup::ConfigurationGroup(const ConfigurationGroup& other): _values(other._values), _groups(other._groups), _configuration(nullptr) {
    /* Deep copy groups */
    for(Group& group: _groups)
        group.group = new ConfigurationGroup(*group.group);
}